

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O3

bool __thiscall summarycalc::loadcoverages(summarycalc *this)

{
  char *pcVar1;
  long *plVar2;
  FILE *__stream;
  ulong uVar3;
  size_t sVar4;
  undefined8 extraout_RAX;
  long *plVar5;
  long lVar6;
  string file;
  OASIS_FLOAT tiv;
  undefined1 local_88 [32];
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  pcVar1 = local_88 + 0x10;
  local_88._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"input/coverages.bin","");
  if ((this->inputpath_)._M_string_length != 0) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)local_88);
    plVar2 = (long *)std::__cxx11::string::replace
                               ((ulong)local_48,0,(char *)0x0,
                                (ulong)(this->inputpath_)._M_dataplus._M_p);
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      local_58 = *plVar5;
      lStack_50 = plVar2[3];
      local_68 = &local_58;
    }
    else {
      local_58 = *plVar5;
      local_68 = (long *)*plVar2;
    }
    local_60 = plVar2[1];
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_88,(string *)&local_68);
    if (local_68 != &local_58) {
      operator_delete(local_68);
    }
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  __stream = fopen((char *)local_88._0_8_,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    uVar3 = ftell(__stream);
    fseek(__stream,0,0);
    std::vector<float,_std::allocator<float>_>::resize
              (&this->coverages_,(ulong)(((uint)(uVar3 >> 2) & 0x3fffffff) + 1));
    lVar6 = 4;
    sVar4 = fread(&local_68,4,1,__stream);
    if ((int)sVar4 != 0) {
      do {
        *(int *)((long)(this->coverages_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar6) = (int)local_68;
        sVar4 = fread(&local_68,4,1,__stream);
        lVar6 = lVar6 + 4;
      } while ((int)sVar4 != 0);
    }
    fclose(__stream);
    if ((char *)local_88._0_8_ != pcVar1) {
      operator_delete((void *)local_88._0_8_);
    }
    return true;
  }
  loadcoverages((summarycalc *)local_88);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  if ((char *)local_88._0_8_ != pcVar1) {
    operator_delete((void *)local_88._0_8_);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

bool summarycalc::loadcoverages()
{
	std::string file = COVERAGES_FILE;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	FILE *fin = fopen(file.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s Error opening file %s\n", __func__, file.c_str());
		exit(-1);
	}

	flseek(fin, 0L, SEEK_END);
	long long sz = fltell(fin);
	flseek(fin, 0L, SEEK_SET);

	OASIS_FLOAT tiv;
	unsigned int nrec = (unsigned int)sz / (unsigned int) sizeof(tiv);

	coverages_.resize(nrec + 1);
	int coverage_id = 0;
	int i = (int) fread(&tiv,sizeof(tiv),1, fin);
	while (i != 0) {
		coverage_id++;
		coverages_[coverage_id] = tiv;
		i = (int)fread(&tiv, sizeof(tiv),
			1, fin);
	}

	fclose(fin);
	return true;

}